

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.c
# Opt level: O1

ZyanStatus ZyrexUpdateThread(ZyanThreadId thread_id)

{
  ZyanStatus ZVar1;
  ZyanThreadId in_RAX;
  ZyanThreadId tid;
  ZyanThreadId local_8;
  
  local_8 = in_RAX;
  ZVar1 = ZyanThreadGetCurrentThreadId(&local_8);
  if ((-1 < (int)ZVar1) && (ZVar1 = 0x80100005, g_transaction_data.transaction_thread_id == local_8)
     ) {
    ZVar1 = 0x100000;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZyrexUpdateThread(ZyanThreadId thread_id)
{
    ZyanThreadId tid;
    ZYAN_CHECK(ZyanThreadGetCurrentThreadId(&tid));

    if (g_transaction_data.transaction_thread_id != tid)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

#ifdef ZYAN_WINDOWS

    ZYAN_ASSERT(g_transaction_data.pending_operations.data);
    ZYAN_ASSERT(g_transaction_data.threads_to_update.data);

    if (thread_id == GetCurrentThreadId())
    {
        return ZYAN_STATUS_SUCCESS;
    }

    const DWORD desired_access = THREAD_SUSPEND_RESUME | THREAD_GET_CONTEXT | THREAD_SET_CONTEXT;
    const HANDLE handle = OpenThread(desired_access, ZYAN_FALSE, thread_id);
    if (handle == ZYAN_NULL)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (SuspendThread(handle) == (DWORD)(-1))
    {
        CloseHandle(handle);
        return ZYAN_STATUS_BAD_SYSTEMCALL;
    }

    return ZyanVectorPushBack(&g_transaction_data.threads_to_update, &handle);

#else

    ZYAN_UNUSED(thread_id);
    return ZYAN_STATUS_SUCCESS;

#endif
}